

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App_inl.hpp
# Opt level: O1

bool __thiscall
CLI::App::_parse_arg
          (App *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,Classifier current_type,bool param_3)

{
  Option *pOVar1;
  pointer *pppOVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer pbVar4;
  pointer pcVar5;
  __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
  _Var6;
  __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
  _Var7;
  Option *pOVar8;
  iterator iVar9;
  pointer psVar10;
  App *pAVar11;
  pointer puVar12;
  unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *puVar13;
  element_type *peVar14;
  size_type sVar15;
  bool bVar16;
  type_conflict tVar17;
  Classifier CVar18;
  bool bVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  Option_p *opt;
  HorribleError *pHVar23;
  long *plVar24;
  pointer puVar25;
  undefined8 *puVar26;
  App *this_00;
  pointer psVar27;
  ArgumentMismatch *pAVar28;
  ulong *puVar29;
  undefined7 in_register_00000011;
  byte bVar30;
  ulong uVar31;
  uint uVar32;
  undefined8 uVar33;
  long lVar34;
  int t;
  string nvalue;
  App *sub;
  string dummy2;
  string arg_name;
  string current;
  string rest;
  string value;
  unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *local_3f0;
  undefined1 local_3d8 [36];
  int local_3b4;
  undefined1 local_3b0 [32];
  App *local_390;
  string local_388;
  vector<CLI::Option*,std::allocator<CLI::Option*>> *local_368;
  string local_360;
  string local_340;
  int local_31c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  _Alloc_hider local_2f8;
  long local_2f0;
  undefined2 local_2e8;
  undefined6 uStack_2e6;
  string local_2d8;
  string local_2b8;
  string local_298;
  _Any_data local_278;
  undefined1 local_268 [16];
  _Any_data local_258;
  undefined1 local_248 [16];
  string local_238;
  string local_218;
  string local_1f8;
  anon_class_32_1_6b09f7e2_for__M_pred local_1d8;
  string local_1b8;
  string local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  char local_148 [16];
  Classifier local_138;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pbVar4 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
  pcVar5 = pbVar4[-1]._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_340,pcVar5,pcVar5 + pbVar4[-1]._M_string_length);
  local_360._M_dataplus._M_p = (pointer)((long)&local_360 + 0x10);
  local_360._M_string_length = 0;
  local_360.field_2._M_local_buf[0] = '\0';
  local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
  local_2d8._M_string_length = 0;
  local_2d8.field_2._M_local_buf[0] = '\0';
  local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
  local_318._M_string_length = 0;
  local_318.field_2._M_local_buf[0] = '\0';
  iVar20 = (int)CONCAT71(in_register_00000011,current_type);
  if (iVar20 == 2) {
    if ((((local_340._M_string_length < 2) || (*local_340._M_dataplus._M_p != '-')) ||
        (local_340._M_dataplus._M_p[1] == 0x2d)) || ((byte)local_340._M_dataplus._M_p[1] < 0x22)) {
      pHVar23 = (HorribleError *)__cxa_allocate_exception(0x38);
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f0,"Short parsed but missing! You should not see this","");
      HorribleError::HorribleError(pHVar23,&local_f0);
      __cxa_throw(pHVar23,&HorribleError::typeinfo,Error::~Error);
    }
    ::std::__cxx11::string::substr((ulong)local_3d8,(ulong)&local_340);
    ::std::__cxx11::string::operator=((string *)&local_360,(string *)local_3d8);
    if ((Option *)local_3d8._0_8_ != (Option *)(local_3d8 + 0x10)) {
      operator_delete((void *)local_3d8._0_8_);
    }
    ::std::__cxx11::string::substr((ulong)local_3d8,(ulong)&local_340);
    ::std::__cxx11::string::operator=((string *)&local_318,(string *)local_3d8);
    if ((Option *)local_3d8._0_8_ != (Option *)(local_3d8 + 0x10)) {
      operator_delete((void *)local_3d8._0_8_);
    }
  }
  else if (iVar20 == 4) {
    bVar16 = detail::split_windows_style(&local_340,&local_360,&local_2d8);
    if (!bVar16) {
      pHVar23 = (HorribleError *)__cxa_allocate_exception(0x38);
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_110,"windows option parsed but missing! You should not see this",
                 "");
      HorribleError::HorribleError(pHVar23,&local_110);
      __cxa_throw(pHVar23,&HorribleError::typeinfo,Error::~Error);
    }
  }
  else {
    if (iVar20 != 3) {
      pHVar23 = (HorribleError *)__cxa_allocate_exception(0x38);
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_130,
                 "parsing got called with invalid option! You should not see this","");
      HorribleError::HorribleError(pHVar23,&local_130);
      __cxa_throw(pHVar23,&HorribleError::typeinfo,Error::~Error);
    }
    bVar16 = detail::split_long(&local_340,&local_360,&local_2d8);
    if (!bVar16) {
      pHVar23 = (HorribleError *)__cxa_allocate_exception(0x38);
      ::std::operator+(&local_50,"Long parsed but missing (you should not see this):",
                       (args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish + -1);
      HorribleError::HorribleError(pHVar23,&local_50);
      __cxa_throw(pHVar23,&HorribleError::typeinfo,Error::~Error);
    }
  }
  _Var6._M_current =
       (this->options_).
       super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  _Var7._M_current =
       (this->options_).
       super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_158._M_allocated_capacity = (size_type)local_148;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_158,local_360._M_dataplus._M_p,
             local_360._M_dataplus._M_p + local_360._M_string_length);
  local_138 = current_type;
  local_3f0 = (unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
              ::std::
              find_if<__gnu_cxx::__normal_iterator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>*,std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>,CLI::App::_parse_arg(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,CLI::detail::Classifier,bool)::_lambda(std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>const&)_1_>
                        (_Var6,_Var7,(anon_class_40_2_a297e68f_for__M_pred *)&local_158);
  if ((char *)local_158._M_allocated_capacity != local_148) {
    operator_delete((void *)local_158._M_allocated_capacity);
  }
  if (local_3f0 !=
      (this->options_).
      super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
LAB_0017034f:
    pbVar4 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    (args->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = pbVar4 + -1;
    pcVar5 = pbVar4[-1]._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar5 != &pbVar4[-1].field_2) {
      operator_delete(pcVar5);
    }
    pOVar8 = (local_3f0->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>
             ._M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
             super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
    if (((pOVar8->inject_separator_ == true) &&
        (pbVar4 = *(pointer *)
                   ((long)&(pOVar8->results_).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   + 8),
        (pOVar8->results_).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != pbVar4)) && (pbVar4[-1]._M_string_length != 0))
    {
      local_178._8_8_ = 0;
      local_168._M_local_buf[0] = '\0';
      local_178._M_allocated_capacity = (size_type)&local_168;
      Option::_add_result(pOVar8,(string *)&local_178,&pOVar8->results_);
      pOVar8->current_option_state_ = parsing;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_allocated_capacity != &local_168) {
        operator_delete((void *)local_178._M_allocated_capacity);
      }
    }
    pOVar8 = (local_3f0->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>
             ._M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
             super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
    if ((pOVar8->trigger_on_result_ == true) && (pOVar8->current_option_state_ == callback_run)) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&pOVar8->results_);
      pOVar8->current_option_state_ = parsing;
    }
    pOVar8 = (local_3f0->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>
             ._M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
             super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
    iVar20 = pOVar8->type_size_min_;
    local_3b4 = pOVar8->expected_min_ * iVar20;
    if (iVar20 <= local_3b4) {
      local_3b4 = iVar20;
    }
    local_3d8._0_4_ = pOVar8->type_size_max_;
    tVar17 = detail::checked_multiply<int>((int *)local_3d8,pOVar8->expected_max_);
    local_31c = 0x20000000;
    if (tVar17) {
      local_31c = (int)local_3d8._0_8_;
    }
    if ((0x1ffffff < local_31c) &&
       (pOVar8 = (local_3f0->_M_t).
                 super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                 super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                 super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl,
       pOVar8->allow_extra_args_ == false)) {
      local_3d8._0_4_ = pOVar8->type_size_max_;
      tVar17 = detail::checked_multiply<int>((int *)local_3d8,pOVar8->expected_min_);
      local_31c = 0x20000000;
      if (tVar17) {
        local_31c = (int)local_3d8._0_8_;
      }
    }
    if (local_31c == 0) {
      pOVar8 = (local_3f0->_M_t).
               super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
               super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
               super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1f8,local_2d8._M_dataplus._M_p,
                 local_2d8._M_dataplus._M_p + local_2d8._M_string_length);
      Option::get_flag_value((string *)local_3d8,pOVar8,&local_360,&local_1f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
        operator_delete(local_1f8._M_dataplus._M_p);
      }
      pOVar8 = (local_3f0->_M_t).
               super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
               super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
               super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_218,local_3d8._0_8_,(pointer)(local_3d8._0_8_ + local_3d8._8_8_));
      Option::_add_result(pOVar8,&local_218,&pOVar8->results_);
      pOVar8->current_option_state_ = parsing;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p);
      }
      local_3b0._0_8_ =
           (local_3f0->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>.
           _M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
           super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      iVar9._M_current =
           (this->parse_order_).super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar9._M_current ==
          (this->parse_order_).super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<CLI::Option*,std::allocator<CLI::Option*>>::_M_realloc_insert<CLI::Option*>
                  ((vector<CLI::Option*,std::allocator<CLI::Option*>> *)&this->parse_order_,iVar9,
                   (Option **)local_3b0);
      }
      else {
        *iVar9._M_current = (Option *)local_3b0._0_8_;
        pppOVar2 = &(this->parse_order_).
                    super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppOVar2 = *pppOVar2 + 1;
      }
      if ((Option *)local_3d8._0_8_ != (Option *)(local_3d8 + 0x10)) {
        operator_delete((void *)local_3d8._0_8_);
      }
LAB_0017080d:
      iVar20 = 0;
    }
    else if (local_2d8._M_string_length == 0) {
      if ((char *)local_318._M_string_length == (char *)0x0) goto LAB_0017080d;
      pOVar8 = (local_3f0->_M_t).
               super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
               super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
               super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      local_258._M_unused._M_object = local_248;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_258,local_318._M_dataplus._M_p,
                 local_318._M_dataplus._M_p + local_318._M_string_length);
      iVar20 = Option::_add_result(pOVar8,(string *)&local_258,&pOVar8->results_);
      pOVar8->current_option_state_ = parsing;
      if ((undefined1 *)local_258._M_unused._0_8_ != local_248) {
        operator_delete(local_258._M_unused._M_object);
      }
      local_3d8._0_8_ =
           (local_3f0->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>.
           _M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
           super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      iVar9._M_current =
           (this->parse_order_).super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar9._M_current ==
          (this->parse_order_).super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<CLI::Option*,std::allocator<CLI::Option*>>::_M_realloc_insert<CLI::Option*>
                  ((vector<CLI::Option*,std::allocator<CLI::Option*>> *)&this->parse_order_,iVar9,
                   (Option **)local_3d8);
      }
      else {
        *iVar9._M_current = (Option *)local_3d8._0_8_;
        pppOVar2 = &(this->parse_order_).
                    super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppOVar2 = *pppOVar2 + 1;
      }
      ::std::__cxx11::string::_M_replace
                ((ulong)&local_318,0,(char *)local_318._M_string_length,0x1e427d);
    }
    else {
      pOVar8 = (local_3f0->_M_t).
               super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
               super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
               super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_238,local_2d8._M_dataplus._M_p,
                 local_2d8._M_dataplus._M_p + local_2d8._M_string_length);
      iVar20 = Option::_add_result(pOVar8,&local_238,&pOVar8->results_);
      pOVar8->current_option_state_ = parsing;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p);
      }
      local_3d8._0_8_ =
           (local_3f0->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>.
           _M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
           super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      iVar9._M_current =
           (this->parse_order_).super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar9._M_current ==
          (this->parse_order_).super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<CLI::Option*,std::allocator<CLI::Option*>>::_M_realloc_insert<CLI::Option*>
                  ((vector<CLI::Option*,std::allocator<CLI::Option*>> *)&this->parse_order_,iVar9,
                   (Option **)local_3d8);
      }
      else {
        *iVar9._M_current = (Option *)local_3d8._0_8_;
        pppOVar2 = &(this->parse_order_).
                    super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppOVar2 = *pppOVar2 + 1;
      }
    }
    if (iVar20 < local_3b4) {
      local_368 = (vector<CLI::Option*,std::allocator<CLI::Option*>> *)&this->parse_order_;
      do {
        pbVar4 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        if ((args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start == pbVar4) {
          pAVar28 = (ArgumentMismatch *)__cxa_allocate_exception(0x38);
          Option::get_name_abi_cxx11_
                    (&local_70,
                     (local_3f0->_M_t).
                     super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                     super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                     super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl,false,false);
          Option::get_type_name_abi_cxx11_
                    (&local_90,
                     (local_3f0->_M_t).
                     super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                     super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                     super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl);
          ArgumentMismatch::TypedAtLeast(pAVar28,&local_70,local_3b4,&local_90);
          __cxa_throw(pAVar28,&ArgumentMismatch::typeinfo,Error::~Error);
        }
        local_3d8._0_8_ = local_3d8 + 0x10;
        pcVar5 = pbVar4[-1]._M_dataplus._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_3d8,pcVar5,pcVar5 + pbVar4[-1]._M_string_length);
        pbVar4 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        (args->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish = pbVar4 + -1;
        pcVar5 = pbVar4[-1]._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar5 != &pbVar4[-1].field_2) {
          operator_delete(pcVar5);
        }
        pOVar8 = (local_3f0->_M_t).
                 super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                 super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                 super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
        local_278._M_unused._M_object = local_268;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_278,local_3d8._0_8_,(pointer)(local_3d8._0_8_ + local_3d8._8_8_)
                  );
        iVar21 = Option::_add_result(pOVar8,(string *)&local_278,&pOVar8->results_);
        pOVar8->current_option_state_ = parsing;
        if ((undefined1 *)local_278._0_8_ != local_268) {
          operator_delete((void *)local_278._0_8_);
        }
        local_3b0._0_8_ =
             (local_3f0->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>
             ._M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
             super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
        iVar9._M_current =
             (this->parse_order_).super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar9._M_current ==
            (this->parse_order_).super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          ::std::vector<CLI::Option*,std::allocator<CLI::Option*>>::_M_realloc_insert<CLI::Option*>
                    (local_368,iVar9,(Option **)local_3b0);
        }
        else {
          *iVar9._M_current = (Option *)local_3b0._0_8_;
          pppOVar2 = &(this->parse_order_).
                      super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          *pppOVar2 = *pppOVar2 + 1;
        }
        if ((Option *)local_3d8._0_8_ != (Option *)(local_3d8 + 0x10)) {
          operator_delete((void *)local_3d8._0_8_);
        }
        iVar20 = iVar20 + iVar21;
      } while (iVar20 < local_3b4);
    }
    iVar21 = local_31c;
    if ((iVar20 < local_31c) ||
       (((local_3f0->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>.
         _M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
         super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl)->allow_extra_args_ == true)) {
      puVar25 = (this->options_).
                super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar12 = (this->options_).
                super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (puVar25 == puVar12) {
        uVar31 = 0;
      }
      else {
        uVar31 = 0;
        do {
          pOVar8 = (puVar25->_M_t).
                   super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                   super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                   super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
          if (((((pOVar8->pname_)._M_string_length != 0) &&
               ((pOVar8->super_OptionBase<CLI::Option>).required_ == true)) &&
              (uVar32 = pOVar8->expected_min_ * pOVar8->type_size_min_, 0 < (int)uVar32)) &&
             (lVar34 = (long)*(pointer *)
                              ((long)&(pOVar8->results_).
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              + 8) -
                       *(long *)&(pOVar8->results_).
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl >> 5, (int)lVar34 < (int)uVar32)) {
            uVar31 = (uVar31 + uVar32) - lVar34;
          }
          puVar25 = puVar25 + 1;
        } while (puVar25 != puVar12);
      }
      local_368 = (vector<CLI::Option*,std::allocator<CLI::Option*>> *)&this->parse_order_;
      while (((iVar20 < iVar21 ||
              (((local_3f0->_M_t).
                super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl)->allow_extra_args_ == true
              )) && ((pbVar4 = (args->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish,
                     (args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start != pbVar4 &&
                     ((CVar18 = _recognize(this,pbVar4 + -1,false), CVar18 == NONE &&
                      (pbVar4 = (args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish,
                      uVar31 < (ulong)((long)pbVar4 -
                                       (long)(args->
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             )._M_impl.super__Vector_impl_data._M_start >> 5))))))))
      {
        if (this->validate_optional_arguments_ == true) {
          local_3d8._0_8_ = local_3d8 + 0x10;
          pcVar5 = pbVar4[-1]._M_dataplus._M_p;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)local_3d8,pcVar5,pcVar5 + pbVar4[-1]._M_string_length);
          Option::_validate((string *)local_3b0,
                            (local_3f0->_M_t).
                            super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>.
                            _M_t.
                            super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>
                            .super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl,
                            (string *)local_3d8,0);
          ::std::__cxx11::string::operator=((string *)local_3d8,(string *)local_3b0);
          if ((Option *)local_3b0._0_8_ != (Option *)(local_3b0 + 0x10)) {
            operator_delete((void *)local_3b0._0_8_);
          }
          uVar33 = local_3d8._8_8_;
          if ((Option *)local_3d8._0_8_ != (Option *)(local_3d8 + 0x10)) {
            operator_delete((void *)local_3d8._0_8_);
          }
          if (uVar33 != 0) break;
        }
        pOVar8 = (local_3f0->_M_t).
                 super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                 super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                 super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
        pbVar4 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
        pcVar5 = pbVar4[-1]._M_dataplus._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2b8,pcVar5,pcVar5 + pbVar4[-1]._M_string_length);
        iVar22 = Option::_add_result(pOVar8,&local_2b8,&pOVar8->results_);
        pOVar8->current_option_state_ = parsing;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
          operator_delete(local_2b8._M_dataplus._M_p);
        }
        local_3d8._0_8_ =
             (local_3f0->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>
             ._M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
             super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
        iVar9._M_current =
             (this->parse_order_).super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar9._M_current ==
            (this->parse_order_).super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          ::std::vector<CLI::Option*,std::allocator<CLI::Option*>>::_M_realloc_insert<CLI::Option*>
                    (local_368,iVar9,(Option **)local_3d8);
        }
        else {
          *iVar9._M_current = (Option *)local_3d8._0_8_;
          pppOVar2 = &(this->parse_order_).
                      super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          *pppOVar2 = *pppOVar2 + 1;
        }
        pbVar4 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        (args->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish = pbVar4 + -1;
        pcVar5 = pbVar4[-1]._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar5 != &pbVar4[-1].field_2) {
          operator_delete(pcVar5);
        }
        iVar20 = iVar20 + iVar22;
      }
      pbVar4 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      if (((args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start != pbVar4) &&
         (CVar18 = _recognize(this,pbVar4 + -1,true), CVar18 == POSITIONAL_MARK)) {
        pbVar4 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        (args->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish = pbVar4 + -1;
        pcVar5 = pbVar4[-1]._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar5 != &pbVar4[-1].field_2) {
          operator_delete(pcVar5);
        }
      }
      if ((0 < iVar21) && (iVar20 == 0 && local_3b4 == 0)) {
        local_198._M_string_length = 0;
        local_198.field_2._M_local_buf[0] = '\0';
        local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
        Option::get_flag_value
                  ((string *)local_3d8,
                   (local_3f0->_M_t).
                   super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                   super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                   super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl,&local_360,&local_198);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_dataplus._M_p != &local_198.field_2) {
          operator_delete(local_198._M_dataplus._M_p);
        }
        pOVar8 = (local_3f0->_M_t).
                 super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                 super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                 super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
        local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_298,local_3d8._0_8_,(pointer)(local_3d8._0_8_ + local_3d8._8_8_)
                  );
        Option::_add_result(pOVar8,&local_298,&pOVar8->results_);
        pOVar8->current_option_state_ = parsing;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p != &local_298.field_2) {
          operator_delete(local_298._M_dataplus._M_p);
        }
        local_3b0._0_8_ =
             (local_3f0->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>
             ._M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
             super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
        iVar9._M_current =
             (this->parse_order_).super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar9._M_current ==
            (this->parse_order_).super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          ::std::vector<CLI::Option*,std::allocator<CLI::Option*>>::_M_realloc_insert<CLI::Option*>
                    (local_368,iVar9,(Option **)local_3b0);
        }
        else {
          *iVar9._M_current = (Option *)local_3b0._0_8_;
          pppOVar2 = &(this->parse_order_).
                      super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          *pppOVar2 = *pppOVar2 + 1;
        }
        if ((Option *)local_3d8._0_8_ != (Option *)(local_3d8 + 0x10)) {
          operator_delete((void *)local_3d8._0_8_);
        }
      }
    }
    if (0 < local_3b4) {
      pOVar8 = (local_3f0->_M_t).
               super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
               super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
               super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      if (iVar20 % pOVar8->type_size_max_ != 0) {
        if (pOVar8->type_size_max_ == pOVar8->type_size_min_) {
          pAVar28 = (ArgumentMismatch *)__cxa_allocate_exception(0x38);
          Option::get_name_abi_cxx11_
                    (&local_b0,
                     (local_3f0->_M_t).
                     super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                     super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                     super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl,false,false);
          pOVar8 = (local_3f0->_M_t).
                   super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                   super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                   super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
          iVar20 = pOVar8->type_size_min_;
          Option::get_type_name_abi_cxx11_(&local_d0,pOVar8);
          ArgumentMismatch::PartialType(pAVar28,&local_b0,iVar20,&local_d0);
          __cxa_throw(pAVar28,&ArgumentMismatch::typeinfo,Error::~Error);
        }
        local_1b8._M_string_length = 0;
        local_1b8.field_2._M_local_buf[0] = '\0';
        local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
        Option::_add_result(pOVar8,&local_1b8,&pOVar8->results_);
        pOVar8->current_option_state_ = parsing;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
          operator_delete(local_1b8._M_dataplus._M_p);
        }
      }
    }
    pOVar8 = (local_3f0->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>
             ._M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
             super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
    if (pOVar8->trigger_on_result_ == true) {
      Option::run_callback(pOVar8);
    }
    bVar16 = true;
    if ((char *)local_318._M_string_length != (char *)0x0) {
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_3d8,"-",&local_318);
      ::std::__cxx11::string::operator=((string *)&local_318,(string *)local_3d8);
      if ((Option *)local_3d8._0_8_ != (Option *)(local_3d8 + 0x10)) {
        operator_delete((void *)local_3d8._0_8_);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(args,&local_318);
    }
    goto LAB_00171434;
  }
  psVar10 = (this->subcommands_).
            super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar27 = (this->subcommands_).
                 super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; psVar27 != psVar10;
      psVar27 = psVar27 + 1) {
    pAVar11 = (psVar27->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if ((((pAVar11->name_)._M_string_length == 0) && (pAVar11->disabled_ == false)) &&
       (bVar16 = _parse_arg(pAVar11,args,current_type,param_3), bVar16)) {
      pAVar11 = (psVar27->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      bVar16 = true;
      if (pAVar11->pre_parse_called_ == false) {
        _trigger_pre_parse(pAVar11,(long)(args->
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(args->
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start >> 5);
      }
      goto LAB_00171434;
    }
  }
  if (((current_type == SHORT) && (this->allow_non_standard_options_ != false)) &&
     (2 < local_340._M_string_length)) {
    local_3d8._0_8_ = local_3d8 + 0x10;
    local_3d8._8_8_ = 0;
    local_3d8[0x10] = '\0';
    local_3b0._8_8_ = 0;
    local_3b0._16_8_ = local_3b0._16_8_ & 0xffffffffffffff00;
    local_2e8 = 0x2d;
    local_2f0 = 1;
    local_3b0._0_8_ = (Option *)(local_3b0 + 0x10);
    local_2f8._M_p = (pointer)&local_2e8;
    plVar24 = (long *)::std::__cxx11::string::_M_append
                                ((char *)&local_2f8,(ulong)local_340._M_dataplus._M_p);
    puVar29 = (ulong *)(plVar24 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar24 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar29) {
      local_388.field_2._M_allocated_capacity = *puVar29;
      local_388.field_2._8_8_ = plVar24[3];
      local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
    }
    else {
      local_388.field_2._M_allocated_capacity = *puVar29;
      local_388._M_dataplus._M_p = (pointer)*plVar24;
    }
    local_388._M_string_length = plVar24[1];
    *plVar24 = (long)puVar29;
    plVar24[1] = 0;
    *(undefined1 *)(plVar24 + 2) = 0;
    detail::split_long(&local_388,(string *)local_3d8,(string *)local_3b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_388._M_dataplus._M_p != &local_388.field_2) {
      operator_delete(local_388._M_dataplus._M_p);
    }
    if (local_2f8._M_p != (pointer)&local_2e8) {
      operator_delete(local_2f8._M_p);
    }
    _Var6._M_current =
         (this->options_).
         super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    _Var7._M_current =
         (this->options_).
         super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    paVar3 = &local_1d8.narg_name.field_2;
    local_1d8.narg_name._M_dataplus._M_p = (pointer)paVar3;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1d8,local_3d8._0_8_,(pointer)(local_3d8._0_8_ + local_3d8._8_8_));
    local_3f0 = (unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
                ::std::
                find_if<__gnu_cxx::__normal_iterator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>*,std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>,CLI::App::_parse_arg(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,CLI::detail::Classifier,bool)::_lambda(std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>const&)_2_>
                          (_Var6,_Var7,&local_1d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8.narg_name._M_dataplus._M_p != paVar3) {
      operator_delete(local_1d8.narg_name._M_dataplus._M_p);
    }
    puVar13 = (this->options_).
              super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (local_3f0 != puVar13) {
      ::std::__cxx11::string::_M_assign((string *)&local_360);
      ::std::__cxx11::string::_M_assign((string *)&local_2d8);
      local_318._M_string_length = 0;
      *local_318._M_dataplus._M_p = '\0';
    }
    if ((Option *)local_3b0._0_8_ != (Option *)(local_3b0 + 0x10)) {
      operator_delete((void *)local_3b0._0_8_);
    }
    if ((Option *)local_3d8._0_8_ != (Option *)(local_3d8 + 0x10)) {
      operator_delete((void *)local_3d8._0_8_);
    }
    if (local_3f0 != puVar13) goto LAB_0017034f;
  }
  if ((this->parent_ == (App *)0x0) || ((this->name_)._M_string_length != 0)) {
    uVar31 = ::std::__cxx11::string::find((char)&local_360,0x2e);
    if ((uVar31 != 0xffffffffffffffff) && (uVar31 < local_360._M_string_length - 1)) {
      ::std::__cxx11::string::substr((ulong)local_3d8,(ulong)&local_360);
      local_390 = _find_subcommand(this,(string *)local_3d8,true,false);
      if ((Option *)local_3d8._0_8_ != (Option *)(local_3d8 + 0x10)) {
        operator_delete((void *)local_3d8._0_8_);
      }
      bVar16 = true;
      bVar30 = 1;
      if (local_390 != (App *)0x0) {
        pbVar4 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        pcVar5 = pbVar4[-1]._M_dataplus._M_p;
        local_3d8._0_8_ = (Option *)(local_3d8 + 0x10);
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_3d8,pcVar5,pcVar5 + pbVar4[-1]._M_string_length);
        pbVar4 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        (args->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish = pbVar4 + -1;
        pcVar5 = pbVar4[-1]._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar5 != &pbVar4[-1].field_2) {
          operator_delete(pcVar5);
        }
        ::std::__cxx11::string::substr((ulong)local_3b0,(ulong)&local_360);
        ::std::__cxx11::string::operator=((string *)&local_360,(string *)local_3b0);
        pOVar8 = (Option *)(local_3b0 + 0x10);
        if ((Option *)local_3b0._0_8_ != pOVar8) {
          operator_delete((void *)local_3b0._0_8_);
        }
        sVar15 = local_360._M_string_length;
        if (local_360._M_string_length < 2) {
          ::std::__cxx11::string::substr((ulong)local_3b0,(ulong)local_3d8);
          *(char *)local_3b0._0_8_ = '-';
          if (2 < (ulong)local_3b0._8_8_) {
            ::std::__cxx11::string::substr((ulong)&local_388,(ulong)local_3b0);
            ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)args,
                       &local_388);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_388._M_dataplus._M_p != &local_388.field_2) {
              operator_delete(local_388._M_dataplus._M_p);
            }
            ::std::__cxx11::string::resize((ulong)local_3b0,'\x02');
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(args,(value_type *)local_3b0);
          if ((Option *)local_3b0._0_8_ != pOVar8) {
            operator_delete((void *)local_3b0._0_8_);
          }
          current_type = SHORT;
        }
        else {
          paVar3 = &local_388.field_2;
          local_388._M_dataplus._M_p = (pointer)paVar3;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_388,"--","");
          ::std::__cxx11::string::substr((ulong)&local_2f8,(ulong)local_3d8);
          uVar33 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_388._M_dataplus._M_p != paVar3) {
            uVar33 = local_388.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar33 < local_388._M_string_length + local_2f0) {
            uVar31 = 0xf;
            if (local_2f8._M_p != (pointer)&local_2e8) {
              uVar31 = CONCAT62(uStack_2e6,local_2e8);
            }
            if (uVar31 < local_388._M_string_length + local_2f0) goto LAB_001711ec;
            puVar26 = (undefined8 *)
                      ::std::__cxx11::string::replace
                                ((ulong)&local_2f8,0,(char *)0x0,(ulong)local_388._M_dataplus._M_p);
          }
          else {
LAB_001711ec:
            puVar26 = (undefined8 *)
                      ::std::__cxx11::string::_M_append((char *)&local_388,(ulong)local_2f8._M_p);
          }
          pOVar1 = (Option *)(puVar26 + 2);
          if ((Option *)*puVar26 == pOVar1) {
            local_3b0._16_8_ = (pOVar1->super_OptionBase<CLI::Option>).group_._M_dataplus._M_p;
            local_3b0._24_8_ = puVar26[3];
            local_3b0._0_8_ = pOVar8;
          }
          else {
            local_3b0._16_8_ = (pOVar1->super_OptionBase<CLI::Option>).group_._M_dataplus._M_p;
            local_3b0._0_8_ = (Option *)*puVar26;
          }
          local_3b0._8_8_ = puVar26[1];
          *puVar26 = pOVar1;
          puVar26[1] = 0;
          *(undefined1 *)&(pOVar1->super_OptionBase<CLI::Option>).group_._M_dataplus._M_p = 0;
          ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)args,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3b0)
          ;
          if ((Option *)local_3b0._0_8_ != pOVar8) {
            operator_delete((void *)local_3b0._0_8_);
          }
          if (local_2f8._M_p != (pointer)&local_2e8) {
            operator_delete(local_2f8._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_388._M_dataplus._M_p != paVar3) {
            operator_delete(local_388._M_dataplus._M_p);
          }
          current_type = LONG;
        }
        local_3b0._8_8_ = 0;
        local_3b0._16_8_ = local_3b0._16_8_ & 0xffffffffffffff00;
        paVar3 = &local_388.field_2;
        local_388._M_string_length = 0;
        local_388.field_2._M_allocated_capacity =
             local_388.field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_388._M_dataplus._M_p = (pointer)paVar3;
        if (((sVar15 < 2) &&
            (bVar30 = (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish[-1]._M_dataplus._M_p[1],
            local_3b0._0_8_ = pOVar8, bVar30 != 0x2d && 0x21 < bVar30)) ||
           (local_3b0._0_8_ = pOVar8,
           bVar19 = detail::split_long((args->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_finish + -1,
                                       (string *)local_3b0,&local_388), bVar19)) {
          bVar19 = _parse_arg(local_390,args,current_type,true);
        }
        else {
          bVar19 = false;
        }
        if (bVar19 == false) {
          pbVar4 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish = pbVar4 + -1;
          pcVar5 = pbVar4[-1]._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar5 != &pbVar4[-1].field_2) {
            operator_delete(pcVar5);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(args,(value_type *)local_3d8);
        }
        else {
          if (local_390->silent_ == false) {
            std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::push_back
                      (&this->parsed_subcommands_,&local_390);
          }
          increment_parsed(this);
          _trigger_pre_parse(this,(long)(args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start >> 5);
          if ((local_390->parse_complete_callback_).super__Function_base._M_manager !=
              (_Manager_type)0x0) {
            _process_env(local_390);
            _process_callbacks(local_390);
            _process_help_flags(local_390,false,false);
            _process_requirements(local_390);
            run_callback(local_390,false,true);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_388._M_dataplus._M_p != paVar3) {
          operator_delete(local_388._M_dataplus._M_p);
        }
        if ((Option *)local_3b0._0_8_ != pOVar8) {
          operator_delete((void *)local_3b0._0_8_);
        }
        if ((Option *)local_3d8._0_8_ != (Option *)(local_3d8 + 0x10)) {
          operator_delete((void *)local_3d8._0_8_);
        }
        bVar30 = bVar19 ^ 1;
      }
      if (bVar30 == 0) goto LAB_00171434;
    }
    if (!param_3) {
      if ((this->parent_ == (App *)0x0) || (pAVar11 = this->parent_, this->fallthrough_ != true)) {
        pbVar4 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        (args->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish = pbVar4 + -1;
        pcVar5 = pbVar4[-1]._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar5 != &pbVar4[-1].field_2) {
          operator_delete(pcVar5);
        }
        local_3d8[0] = current_type;
        if (this->allow_extras_ == false) {
          psVar27 = (this->subcommands_).
                    super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          psVar10 = (this->subcommands_).
                    super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          if (psVar27 != psVar10) {
            bVar16 = false;
            do {
              peVar14 = (psVar27->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
              if (((peVar14->name_)._M_string_length == 0) && (peVar14->allow_extras_ == true)) {
                ::std::
                vector<std::pair<CLI::detail::Classifier,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifier,std::__cxx11::string>>>
                ::emplace_back<CLI::detail::Classifier&,std::__cxx11::string_const&>
                          ((vector<std::pair<CLI::detail::Classifier,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifier,std::__cxx11::string>>>
                            *)&peVar14->missing_,local_3d8,&local_340);
                if (!bVar16) goto LAB_00171576;
                break;
              }
              psVar27 = psVar27 + 1;
              bVar16 = psVar27 == psVar10;
            } while (!bVar16);
          }
        }
        ::std::
        vector<std::pair<CLI::detail::Classifier,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifier,std::__cxx11::string>>>
        ::emplace_back<CLI::detail::Classifier&,std::__cxx11::string_const&>
                  ((vector<std::pair<CLI::detail::Classifier,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifier,std::__cxx11::string>>>
                    *)&this->missing_,local_3d8,&local_340);
LAB_00171576:
        bVar16 = true;
      }
      else {
        do {
          this_00 = pAVar11;
          if (this_00->parent_ == (App *)0x0) break;
          pAVar11 = this_00->parent_;
        } while ((this_00->name_)._M_string_length == 0);
        bVar16 = _parse_arg(this_00,args,current_type,false);
      }
      goto LAB_00171434;
    }
  }
  bVar16 = false;
LAB_00171434:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._M_dataplus._M_p != &local_318.field_2) {
    operator_delete(local_318._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)((long)&local_360 + 0x10U)) {
    operator_delete(local_360._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340._M_dataplus._M_p != &local_340.field_2) {
    operator_delete(local_340._M_dataplus._M_p);
  }
  return bVar16;
}

Assistant:

CLI11_INLINE bool
App::_parse_arg(std::vector<std::string> &args, detail::Classifier current_type, bool local_processing_only) {

    std::string current = args.back();

    std::string arg_name;
    std::string value;
    std::string rest;

    switch(current_type) {
    case detail::Classifier::LONG:
        if(!detail::split_long(current, arg_name, value))
            throw HorribleError("Long parsed but missing (you should not see this):" + args.back());
        break;
    case detail::Classifier::SHORT:
        if(!detail::split_short(current, arg_name, rest))
            throw HorribleError("Short parsed but missing! You should not see this");
        break;
    case detail::Classifier::WINDOWS_STYLE:
        if(!detail::split_windows_style(current, arg_name, value))
            throw HorribleError("windows option parsed but missing! You should not see this");
        break;
    case detail::Classifier::SUBCOMMAND:
    case detail::Classifier::SUBCOMMAND_TERMINATOR:
    case detail::Classifier::POSITIONAL_MARK:
    case detail::Classifier::NONE:
    default:
        throw HorribleError("parsing got called with invalid option! You should not see this");
    }

    auto op_ptr = std::find_if(std::begin(options_), std::end(options_), [arg_name, current_type](const Option_p &opt) {
        if(current_type == detail::Classifier::LONG)
            return opt->check_lname(arg_name);
        if(current_type == detail::Classifier::SHORT)
            return opt->check_sname(arg_name);
        // this will only get called for detail::Classifier::WINDOWS_STYLE
        return opt->check_lname(arg_name) || opt->check_sname(arg_name);
    });

    // Option not found
    while(op_ptr == std::end(options_)) {
        // using while so we can break
        for(auto &subc : subcommands_) {
            if(subc->name_.empty() && !subc->disabled_) {
                if(subc->_parse_arg(args, current_type, local_processing_only)) {
                    if(!subc->pre_parse_called_) {
                        subc->_trigger_pre_parse(args.size());
                    }
                    return true;
                }
            }
        }
        if(allow_non_standard_options_ && current_type == detail::Classifier::SHORT && current.size() > 2) {
            std::string narg_name;
            std::string nvalue;
            detail::split_long(std::string{'-'} + current, narg_name, nvalue);
            op_ptr = std::find_if(std::begin(options_), std::end(options_), [narg_name](const Option_p &opt) {
                return opt->check_sname(narg_name);
            });
            if(op_ptr != std::end(options_)) {
                arg_name = narg_name;
                value = nvalue;
                rest.clear();
                break;
            }
        }

        // don't capture missing if this is a nameless subcommand and nameless subcommands can't fallthrough
        if(parent_ != nullptr && name_.empty()) {
            return false;
        }

        // now check for '.' notation of subcommands
        auto dotloc = arg_name.find_first_of('.', 1);
        if(dotloc != std::string::npos && dotloc < arg_name.size() - 1) {
            // using dot notation is equivalent to single argument subcommand
            auto *sub = _find_subcommand(arg_name.substr(0, dotloc), true, false);
            if(sub != nullptr) {
                std::string v = args.back();
                args.pop_back();
                arg_name = arg_name.substr(dotloc + 1);
                if(arg_name.size() > 1) {
                    args.push_back(std::string("--") + v.substr(dotloc + 3));
                    current_type = detail::Classifier::LONG;
                } else {
                    auto nval = v.substr(dotloc + 2);
                    nval.front() = '-';
                    if(nval.size() > 2) {
                        // '=' not allowed in short form arguments
                        args.push_back(nval.substr(3));
                        nval.resize(2);
                    }
                    args.push_back(nval);
                    current_type = detail::Classifier::SHORT;
                }
                std::string dummy1, dummy2;
                bool val = false;
                if((current_type == detail::Classifier::SHORT && detail::valid_first_char(args.back()[1])) ||
                   detail::split_long(args.back(), dummy1, dummy2)) {
                    val = sub->_parse_arg(args, current_type, true);
                }

                if(val) {
                    if(!sub->silent_) {
                        parsed_subcommands_.push_back(sub);
                    }
                    // deal with preparsing
                    increment_parsed();
                    _trigger_pre_parse(args.size());
                    // run the parse complete callback since the subcommand processing is now complete
                    if(sub->parse_complete_callback_) {
                        sub->_process_env();
                        sub->_process_callbacks();
                        sub->_process_help_flags();
                        sub->_process_requirements();
                        sub->run_callback(false, true);
                    }
                    return true;
                }
                args.pop_back();
                args.push_back(v);
            }
        }
        if(local_processing_only) {
            return false;
        }
        // If a subcommand, try the main command
        if(parent_ != nullptr && fallthrough_)
            return _get_fallthrough_parent()->_parse_arg(args, current_type, false);

        // Otherwise, add to missing
        args.pop_back();
        _move_to_missing(current_type, current);
        return true;
    }

    args.pop_back();

    // Get a reference to the pointer to make syntax bearable
    Option_p &op = *op_ptr;
    /// if we require a separator add it here
    if(op->get_inject_separator()) {
        if(!op->results().empty() && !op->results().back().empty()) {
            op->add_result(std::string{});
        }
    }
    if(op->get_trigger_on_parse() && op->current_option_state_ == Option::option_state::callback_run) {
        op->clear();
    }
    int min_num = (std::min)(op->get_type_size_min(), op->get_items_expected_min());
    int max_num = op->get_items_expected_max();
    // check container like options to limit the argument size to a single type if the allow_extra_flags argument is
    // set. 16 is somewhat arbitrary (needs to be at least 4)
    if(max_num >= detail::expected_max_vector_size / 16 && !op->get_allow_extra_args()) {
        auto tmax = op->get_type_size_max();
        max_num = detail::checked_multiply(tmax, op->get_expected_min()) ? tmax : detail::expected_max_vector_size;
    }
    // Make sure we always eat the minimum for unlimited vectors
    int collected = 0;     // total number of arguments collected
    int result_count = 0;  // local variable for number of results in a single arg string
    // deal with purely flag like things
    if(max_num == 0) {
        auto res = op->get_flag_value(arg_name, value);
        op->add_result(res);
        parse_order_.push_back(op.get());
    } else if(!value.empty()) {  // --this=value
        op->add_result(value, result_count);
        parse_order_.push_back(op.get());
        collected += result_count;
        // -Trest
    } else if(!rest.empty()) {
        op->add_result(rest, result_count);
        parse_order_.push_back(op.get());
        rest = "";
        collected += result_count;
    }

    // gather the minimum number of arguments
    while(min_num > collected && !args.empty()) {
        std::string current_ = args.back();
        args.pop_back();
        op->add_result(current_, result_count);
        parse_order_.push_back(op.get());
        collected += result_count;
    }

    if(min_num > collected) {  // if we have run out of arguments and the minimum was not met
        throw ArgumentMismatch::TypedAtLeast(op->get_name(), min_num, op->get_type_name());
    }

    // now check for optional arguments
    if(max_num > collected || op->get_allow_extra_args()) {  // we allow optional arguments
        auto remreqpos = _count_remaining_positionals(true);
        // we have met the minimum now optionally check up to the maximum
        while((collected < max_num || op->get_allow_extra_args()) && !args.empty() &&
              _recognize(args.back(), false) == detail::Classifier::NONE) {
            // If any required positionals remain, don't keep eating
            if(remreqpos >= args.size()) {
                break;
            }
            if(validate_optional_arguments_) {
                std::string arg = args.back();
                arg = op->_validate(arg, 0);
                if(!arg.empty()) {
                    break;
                }
            }
            op->add_result(args.back(), result_count);
            parse_order_.push_back(op.get());
            args.pop_back();
            collected += result_count;
        }

        // Allow -- to end an unlimited list and "eat" it
        if(!args.empty() && _recognize(args.back()) == detail::Classifier::POSITIONAL_MARK)
            args.pop_back();
        // optional flag that didn't receive anything now get the default value
        if(min_num == 0 && max_num > 0 && collected == 0) {
            auto res = op->get_flag_value(arg_name, std::string{});
            op->add_result(res);
            parse_order_.push_back(op.get());
        }
    }
    // if we only partially completed a type then add an empty string if allowed for later processing
    if(min_num > 0 && (collected % op->get_type_size_max()) != 0) {
        if(op->get_type_size_max() != op->get_type_size_min()) {
            op->add_result(std::string{});
        } else {
            throw ArgumentMismatch::PartialType(op->get_name(), op->get_type_size_min(), op->get_type_name());
        }
    }
    if(op->get_trigger_on_parse()) {
        op->run_callback();
    }
    if(!rest.empty()) {
        rest = "-" + rest;
        args.push_back(rest);
    }
    return true;
}